

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::Parse(ParserImpl *this,Message *output)

{
  bool bVar1;
  LogMessage *pLVar2;
  LogMessage local_20;
  
  while ((this->tokenizer_).current_.type != TYPE_END) {
    bVar1 = ConsumeField(this,output);
    if (!bVar1) {
      return false;
    }
  }
  if ((this->had_errors_ == false) && (this->recursion_limit_ != this->initial_recursion_limit_)) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
               ,0x15f,"had_errors_ || recursion_limit_ == initial_recursion_limit_");
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (&local_20,(char (*) [43])"Recursion limit at end of parse should be ");
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,this->initial_recursion_limit_);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [11])", but was ");
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,this->recursion_limit_)
    ;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [17])". Difference of ");
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,this->initial_recursion_limit_ - this->recursion_limit_);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (pLVar2,(char (*) [46])" stack frames not accounted for stack unwind.");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_20);
  }
  return (bool)(this->had_errors_ ^ 1);
}

Assistant:

bool Parse(Message* output) {
    // Consume fields until we cannot do so anymore.
    while (true) {
      if (LookingAtType(io::Tokenizer::TYPE_END)) {
        // Ensures recursion limit properly unwinded, but only for success
        // cases. This implicitly avoids the check when `Parse` returns false
        // via `DO(...)`.
        ABSL_DCHECK(had_errors_ || recursion_limit_ == initial_recursion_limit_)
            << "Recursion limit at end of parse should be "
            << initial_recursion_limit_ << ", but was " << recursion_limit_
            << ". Difference of " << initial_recursion_limit_ - recursion_limit_
            << " stack frames not accounted for stack unwind.";

        return !had_errors_;
      }

      DO(ConsumeField(output));
    }
  }